

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_utils.c
# Opt level: O1

int Reset(WebPWorker *worker)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  uint uVar2;
  
  worker->had_error = 0;
  if (worker->status_ == OK) {
    uVar2 = 1;
  }
  else if (worker->status_ == NOT_OK) {
    __mutex = (pthread_mutex_t *)WebPSafeCalloc(1,0x60);
    worker->impl_ = __mutex;
    if (__mutex != (pthread_mutex_t *)0x0) {
      iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      if (iVar1 == 0) {
        iVar1 = pthread_cond_init((pthread_cond_t *)(__mutex + 1),(pthread_condattr_t *)0x0);
        if (iVar1 == 0) {
          pthread_mutex_lock(__mutex);
          iVar1 = pthread_create((pthread_t *)((long)__mutex + 0x58),(pthread_attr_t *)0x0,
                                 ThreadLoop,worker);
          if (iVar1 == 0) {
            worker->status_ = OK;
            pthread_mutex_unlock(__mutex);
            return (uint)(iVar1 == 0);
          }
          pthread_mutex_unlock(__mutex);
          pthread_mutex_destroy(__mutex);
          pthread_cond_destroy((pthread_cond_t *)(__mutex + 1));
        }
        else {
          pthread_mutex_destroy(__mutex);
        }
      }
      WebPSafeFree(__mutex);
      worker->impl_ = (void *)0x0;
    }
    uVar2 = 0;
  }
  else {
    ChangeState(worker,OK);
    uVar2 = (uint)(worker->had_error == 0);
  }
  return uVar2;
}

Assistant:

static int Reset(WebPWorker* const worker) {
  int ok = 1;
  worker->had_error = 0;
  if (worker->status_ < OK) {
#ifdef WEBP_USE_THREAD
    WebPWorkerImpl* const impl =
        (WebPWorkerImpl*)WebPSafeCalloc(1, sizeof(WebPWorkerImpl));
    worker->impl_ = (void*)impl;
    if (worker->impl_ == NULL) {
      return 0;
    }
    if (pthread_mutex_init(&impl->mutex_, NULL)) {
      goto Error;
    }
    if (pthread_cond_init(&impl->condition_, NULL)) {
      pthread_mutex_destroy(&impl->mutex_);
      goto Error;
    }
    pthread_mutex_lock(&impl->mutex_);
    ok = !pthread_create(&impl->thread_, NULL, ThreadLoop, worker);
    if (ok) worker->status_ = OK;
    pthread_mutex_unlock(&impl->mutex_);
    if (!ok) {
      pthread_mutex_destroy(&impl->mutex_);
      pthread_cond_destroy(&impl->condition_);
 Error:
      WebPSafeFree(impl);
      worker->impl_ = NULL;
      return 0;
    }
#else
    worker->status_ = OK;
#endif
  } else if (worker->status_ > OK) {
    ok = Sync(worker);
  }
  assert(!ok || (worker->status_ == OK));
  return ok;
}